

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

bool __thiscall stackjit::ClassMetadata::makeVirtualFunctionTable(ClassMetadata *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  ClassType *this_01;
  ulong uVar2;
  size_t i;
  ClassMetadata *pCVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  string *psVar6;
  FunctionDefinition *function;
  size_type sVar7;
  BytePtr *ppuVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  __node_base *p_Var11;
  bool bVar12;
  int iVar13;
  _Rb_tree_color _Var14;
  __hashtable *p_Var15;
  __hashtable *__h_1;
  __hashtable *__h;
  undefined1 local_d8 [40];
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  virtualFuncMapping;
  string rootSignature;
  
  if (this->mVirtualFunctionTable == (BytePtr *)0x0) {
    __h = (__hashtable *)
          (this->mVirtualFunctions).
          super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = this->mParentClass;
    p_Var15 = (__hashtable *)
              (this->mVirtualFunctions).
              super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var14 = _S_red;
    bVar12 = false;
    if (__h != p_Var15 || this_01 != (ClassType *)0x0) {
      virtualFuncMapping._M_h._M_buckets = &virtualFuncMapping._M_h._M_single_bucket;
      virtualFuncMapping._M_h._M_bucket_count = 1;
      virtualFuncMapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      virtualFuncMapping._M_h._M_element_count = 0;
      virtualFuncMapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      virtualFuncMapping._M_h._M_rehash_policy._M_next_resize = 0;
      virtualFuncMapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
      if (this_01 != (ClassType *)0x0) {
        pCVar3 = ClassType::metadata(this_01);
        makeVirtualFunctionTable(pCVar3);
        pCVar3 = ClassType::metadata(this->mParentClass);
        p_Var5 = (pCVar3->mIndexToVirtualFunction)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
        _Var14 = _S_red;
        iVar13 = 0;
        while ((_Rb_tree_header *)p_Var5 !=
               &(pCVar3->mIndexToVirtualFunction)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::string((string *)&name,(string *)&p_Var5[1]._M_parent);
          _Var1 = p_Var5[1]._M_color;
          local_d8._0_4_ = _Var1;
          std::__cxx11::string::string((string *)(local_d8 + 8),(string *)&name);
          std::
          _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
          ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                    ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                      *)&this->mIndexToVirtualFunction,
                     (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_d8);
          std::__cxx11::string::~string((string *)(local_d8 + 8));
          std::__cxx11::string::string((string *)local_d8,(string *)&name);
          local_d8._32_4_ = _Var1;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,int>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->mVirtualFunctionToIndex,
                     (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&virtualFuncMapping,&name);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          if ((int)_Var14 <= (int)_Var1) {
            _Var14 = _Var1;
          }
          std::__cxx11::string::~string((string *)&name);
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          iVar13 = 1;
        }
        _Var14 = iVar13 + _Var14;
        p_Var15 = (__hashtable *)
                  (this->mVirtualFunctions).
                  super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __h = (__hashtable *)
              (this->mVirtualFunctions).
              super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      }
      p_Var11 = &virtualFuncMapping._M_h._M_before_begin;
      this_00 = &this->mVirtualFunctionToIndex;
      local_b0 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)&this->mIndexToVirtualFunction;
      for (; p_Var15 != __h; p_Var15 = (__hashtable *)&p_Var15->_M_bucket_count) {
        FunctionSignature::from
                  ((FunctionSignature *)local_d8,(FunctionDefinition *)p_Var15->_M_buckets);
        psVar6 = FunctionSignature::str_abi_cxx11_((FunctionSignature *)local_d8);
        std::__cxx11::string::string((string *)&name,(string *)psVar6);
        std::__cxx11::string::~string((string *)local_d8);
        function = getVirtualFunctionRootDefinition(this,(FunctionDefinition *)p_Var15->_M_buckets);
        FunctionSignature::from((FunctionSignature *)local_d8,function);
        psVar6 = FunctionSignature::str_abi_cxx11_((FunctionSignature *)local_d8);
        std::__cxx11::string::string((string *)&rootSignature,(string *)psVar6);
        std::__cxx11::string::~string((string *)local_d8);
        sVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count(&this_00->_M_h,&rootSignature);
        if (sVar7 == 0) {
          local_d8._0_4_ = _Var14;
          std::__cxx11::string::string((string *)(local_d8 + 8),(string *)&name);
          std::
          _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
          ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                    (local_b0,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_d8);
          std::__cxx11::string::~string((string *)(local_d8 + 8));
          std::__cxx11::string::string((string *)local_d8,(string *)&name);
          local_d8._32_4_ = _Var14;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,int>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this_00,
                     (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
          _Var14 = _Var14 + _S_black;
        }
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&virtualFuncMapping,&rootSignature);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        std::__cxx11::string::~string((string *)&rootSignature);
        std::__cxx11::string::~string((string *)&name);
      }
      uVar2 = (this->mIndexToVirtualFunction)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ppuVar8 = (BytePtr *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
      this->mVirtualFunctionTable = ppuVar8;
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        this->mVirtualFunctionTable[uVar9] = (BytePtr)0x0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->mVirtualFunctionMapping,virtualFuncMapping._M_h._M_element_count);
      while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)(p_Var11 + 1));
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((this->mVirtualFunctionMapping).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *pmVar10));
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&virtualFuncMapping._M_h);
      bVar12 = true;
    }
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool ClassMetadata::makeVirtualFunctionTable() {
		if (mVirtualFunctionTable == nullptr && (mVirtualFunctions.size() > 0 || mParentClass != nullptr)) {
			int virtualFuncIndex = 0;
			bool hasParentVirtual = false;
			std::unordered_map<std::string, std::string> virtualFuncMapping;

			//Create for parent class
			if (mParentClass != nullptr) {
				mParentClass->metadata()->makeVirtualFunctionTable();

				//Add the parent class virtual functions
				for (auto& virtualFunc : mParentClass->metadata()->mIndexToVirtualFunction) {
					auto name = virtualFunc.second;
					auto index = virtualFunc.first;
					mIndexToVirtualFunction.insert({ index, name });
					mVirtualFunctionToIndex.insert({ name, index });
					virtualFuncMapping[name] = name;
					virtualFuncIndex = std::max(virtualFuncIndex, index);
					hasParentVirtual = true;
				}
			}

			if (hasParentVirtual) {
				virtualFuncIndex++;
			}

			//Now for this class
			for (auto& virtualFunc : mVirtualFunctions) {
				auto signature = FunctionSignature::from(*virtualFunc).str();
				auto rootDef = getVirtualFunctionRootDefinition(virtualFunc);
				auto rootSignature = FunctionSignature::from(*rootDef).str();

				if (mVirtualFunctionToIndex.count(rootSignature) == 0) {
					mIndexToVirtualFunction.insert({ virtualFuncIndex, signature });
					mVirtualFunctionToIndex.insert({ signature, virtualFuncIndex });
					virtualFuncIndex++;
				}

				virtualFuncMapping[rootSignature] = signature;
			}

			//Create the actual table. Note that these functions are bound when compiled.
			mVirtualFunctionTable = new BytePtr[mIndexToVirtualFunction.size()];
			for (std::size_t i = 0; i < mIndexToVirtualFunction.size(); i++) {
				mVirtualFunctionTable[i] = nullptr;
			}

			//Create the final mapping
			mVirtualFunctionMapping.resize(virtualFuncMapping.size());
			for (auto& virtualFunc : virtualFuncMapping) {
				mVirtualFunctionMapping[mVirtualFunctionToIndex[virtualFunc.first]] = virtualFunc.second;
			}

			return true;
		}

		return false;
	}